

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12a5786::Scenario::ReceivedResponse(Scenario *this,NodeId peer,uint256 *txhash)

{
  pointer *pppVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *__alloc;
  Runner *pRVar2;
  anon_class_48_3_6b2a3e87 *__first;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__last;
  size_type __n;
  pointer __result;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar3;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar4;
  anon_class_48_3_6b2a3e87 *in_RCX;
  anon_class_48_3_6b2a3e87 *__args_1;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000000L>_> local_68;
  NodeId local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->m_runner;
  local_58 = *(undefined8 *)(txhash->super_base_blob<256U>).m_data._M_elems;
  uStack_50 = *(undefined8 *)((txhash->super_base_blob<256U>).m_data._M_elems + 8);
  local_48 = *(undefined8 *)((txhash->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_40 = *(undefined8 *)((txhash->super_base_blob<256U>).m_data._M_elems + 0x18);
  ppVar4 = (pRVar2->actions).
           super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68.__r = (rep)pRVar2;
  local_60 = peer;
  if (ppVar4 == (pRVar2->actions).
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __alloc = &pRVar2->actions;
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(__alloc,1,"vector::_M_realloc_insert");
    __first = (anon_class_48_3_6b2a3e87 *)
              (pRVar2->actions).
              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __args_1 = __first;
    __result = _GLOBAL__N_1::std::
               _Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ::_M_allocate(&__alloc->
                              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                             ,__n);
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::ReceivedResponse(long,uint256_const&)::_lambda()_1_>
              ((allocator_type *)(((long)ppVar4 - (long)__first) + (long)__result),
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)&this->m_now,&local_68,__args_1);
    ppVar3 = std::
             __relocate_a_1<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
                       ((pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                         *)__first,ppVar4,__result,
                        (allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                         *)__alloc);
    ppVar4 = std::
             __relocate_a_1<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
                       (ppVar4,__last,ppVar3 + 1,
                        (allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                         *)__alloc);
    _GLOBAL__N_1::std::
    _Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ::_M_deallocate(&__alloc->
                     super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                    ,(pointer)__first,
                    ((long)(pRVar2->actions).
                           super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first) /
                    0x28);
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + __n;
  }
  else {
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::ReceivedResponse(long,uint256_const&)::_lambda()_1_>
              ((allocator_type *)ppVar4,
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)&this->m_now,&local_68,in_RCX);
    pppVar1 = &(pRVar2->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedResponse(NodeId peer, const uint256& txhash)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ReceivedResponse(peer, txhash);
            runner.txrequest.SanityCheck();
        });
    }